

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  Impl *this_01;
  size_t sVar1;
  undefined1 uVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  String *pSVar7;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_68 [16];
  undefined8 uStack_58;
  Mutex local_50;
  Clock *local_38;
  
  sVar5 = path.parts.size_;
  pSVar7 = path.parts.ptr;
  if (sVar5 == 1) {
    this_00 = &this->impl;
    kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    this_01 = &(this->impl).value;
    sVar5 = (pSVar7->content).size_;
    if (sVar5 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name.content.size_ = sVar5 + (sVar5 == 0);
    name.content.ptr = pcVar6;
    local_50.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)this_00;
    local_38 = (Clock *)this_01;
    MVar3 = Impl::openEntry(this_01,name,mode);
    uVar2 = MVar3.ptr != (EntryImpl *)0x0;
    if ((bool)uVar2) {
      local_68._0_8_ = (*(code *)**(undefined8 **)this_01->clock)();
      heapString((String *)(local_68 + 8),content.content.ptr,content.content.size_ - 1);
      if (((MVar3.ptr)->node).tag != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy(&(MVar3.ptr)->node);
      }
      ((MVar3.ptr)->node).field_1.forceAligned = (void *)local_68._0_8_;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 8) = local_68._8_8_;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 0x10) = uStack_58;
      *(undefined8 *)((long)&((MVar3.ptr)->node).field_1 + 0x18) = local_50._0_8_;
      local_68._8_8_ = (_func_int **)0x0;
      uStack_58._0_4_ = 0;
      uStack_58._4_4_ = 0;
      ((MVar3.ptr)->node).tag = 3;
      lVar4 = (*(code *)**(undefined8 **)this_01->clock)();
      (this->impl).value.lastModified.value.value = lVar4;
    }
    kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  else if (sVar5 == 0) {
    if ((mode & CREATE) == 0) {
      uVar2 = 0;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4d4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)local_68);
    }
    else {
      uVar2 = 0;
    }
  }
  else {
    sVar1 = (pSVar7->content).size_;
    if (sVar1 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar7->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar6;
    name_00.content.ptr = (char *)this;
    local_50.waitersHead.ptr = (Waiter *)content.content.ptr;
    tryGetParent((InMemoryDirectory *)local_68,name_00,(int)sVar1 + (uint)(sVar1 == 0));
    if ((_func_int **)local_68._8_8_ == (_func_int **)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4e3,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
      kj::_::Debug::Fault::~Fault((Fault *)local_68);
      uVar2 = 0;
    }
    else {
      uVar2 = (**(code **)(*(_func_int **)local_68._8_8_ + 0x98))
                        (local_68._8_8_,pSVar7 + 1,sVar5 - 1,local_50.waitersHead.ptr,
                         content.content.size_,mode);
      (**(code **)(((String *)local_68._0_8_)->content).ptr)
                (local_68._0_8_,local_68._8_8_ + *(long *)(*(_func_int **)local_68._8_8_ + -0x10));
    }
  }
  return (bool)uVar2;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        entry->init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }